

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O2

void middle_finish_loading(middle_t *middle,uint32 next_end)

{
  byte length;
  bitarr_address_t address;
  
  length = (middle->next_mask).bits;
  address.offset =
       (uint)(middle->base).total_bits * ((middle->base).insert_index + 1) - (uint)length;
  address.base = (middle->base).base;
  address._12_4_ = 0;
  bitarr_write_int25(address,length,next_end);
  return;
}

Assistant:

static void
middle_finish_loading(middle_t * middle, uint32 next_end)
{
    bitarr_address_t address;
    address.base = middle->base.base;
    address.offset =
        (middle->base.insert_index + 1) * middle->base.total_bits -
        middle->next_mask.bits;
    bitarr_write_int25(address, middle->next_mask.bits, next_end);
}